

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

float * drwav_open_memory_and_read_pcm_frames_f32
                  (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
                  drwav_uint64 *totalFrameCountOut)

{
  float *pfVar1;
  uint channels;
  uint sampleRate;
  drwav_uint64 totalSampleCount;
  uint local_28;
  uint local_24;
  ulong local_20;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (drwav_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  pfVar1 = drwav_open_memory_and_read_f32(data,dataSize,&local_28,&local_24,&local_20);
  if (pfVar1 != (float *)0x0) {
    if (channelsOut != (uint *)0x0) {
      *channelsOut = local_28;
    }
    if (sampleRateOut != (uint *)0x0) {
      *sampleRateOut = local_24;
    }
    if (totalFrameCountOut != (drwav_uint64 *)0x0) {
      *totalFrameCountOut = local_20 / local_28;
    }
  }
  return pfVar1;
}

Assistant:

float* drwav_open_memory_and_read_pcm_frames_f32(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut)
{
    if (channelsOut) *channelsOut = 0;
    if (sampleRateOut) *sampleRateOut = 0;
    if (totalFrameCountOut) *totalFrameCountOut = 0;

    unsigned int channels;
    unsigned int sampleRate;
    drwav_uint64 totalSampleCount;
    float* result = drwav_open_memory_and_read_f32(data, dataSize, &channels, &sampleRate, &totalSampleCount);
    if (result == NULL) {
        return NULL;
    }

    if (channelsOut) *channelsOut = channels;
    if (sampleRateOut) *sampleRateOut = sampleRate;
    if (totalFrameCountOut) *totalFrameCountOut = totalSampleCount / channels;

    return result;
}